

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O2

LY_ERR lydxml_opaq_r(lyxml_ctx *xmlctx,lyd_node *parent)

{
  ly_bool lVar1;
  LYXML_PARSER_STATUS LVar2;
  char *name;
  char *prefix;
  size_t sVar3;
  ly_ctx *ctx;
  char *__s;
  long lVar4;
  lyd_node *plVar5;
  LY_ERR LVar6;
  lyxml_ns *plVar7;
  size_t module_key_len;
  lysc_node **pplVar8;
  char cVar9;
  lyd_node *node;
  uint local_5c;
  lyd_attr *attr;
  char *local_50;
  size_t local_48;
  lyd_node *local_40;
  size_t local_38;
  
  attr = (lyd_attr *)0x0;
  node = (lyd_node *)0x0;
  if (xmlctx->status != LYXML_ELEMENT) {
    __assert_fail("xmlctx->status == LYXML_ELEMENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x586,"LY_ERR lydxml_opaq_r(struct lyxml_ctx *, struct lyd_node *)");
  }
  name = (xmlctx->field_5).name;
  local_38 = (xmlctx->field_6).name_len;
  prefix = (xmlctx->field_3).prefix;
  sVar3 = (xmlctx->field_4).prefix_len;
  plVar7 = lyxml_ns_get(&xmlctx->ns,prefix,sVar3);
  if (plVar7 == (lyxml_ns *)0x0) {
    lydxml_log_namespace_err(xmlctx,prefix,sVar3,(char *)0x0,0);
    LVar6 = LY_EVALID;
  }
  else {
    local_40 = parent;
    LVar6 = lyxml_ctx_next(xmlctx);
    if (LVar6 == LY_SUCCESS) {
      LVar2 = xmlctx->status;
      if (LVar2 == LYXML_ATTRIBUTE) {
        LVar6 = lydxml_attrs(xmlctx,&attr);
        if (LVar6 != LY_SUCCESS) {
          return LVar6;
        }
        LVar2 = xmlctx->status;
      }
      if (LVar2 != LYXML_ELEM_CONTENT) {
        __assert_fail("xmlctx->status == LYXML_ELEM_CONTENT",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                      ,0x59a,"LY_ERR lydxml_opaq_r(struct lyxml_ctx *, struct lyd_node *)");
      }
      local_5c = (uint)(xmlctx->field_6).dynamic;
      if ((xmlctx->field_6).dynamic != 0) {
        (xmlctx->field_6).dynamic = '\0';
      }
      local_50 = (xmlctx->field_3).prefix;
      local_48 = (xmlctx->field_4).prefix_len;
      lVar1 = (xmlctx->field_5).ws_only;
      ctx = xmlctx->ctx;
      __s = plVar7->uri;
      module_key_len = strlen(__s);
      LVar6 = lyd_create_opaq(ctx,name,local_38,prefix,sVar3,__s,module_key_len,(char *)0x0,0,
                              (ly_bool *)0x0,LY_VALUE_XML,(void *)0x0,0,&node);
      sVar3 = local_48;
      if (LVar6 == LY_SUCCESS) {
        *(lyd_attr **)(node + 2) = attr;
        attr = (lyd_attr *)0x0;
        LVar6 = lyxml_ctx_next(xmlctx);
        cVar9 = (char)local_5c;
        while (LVar6 == LY_SUCCESS) {
          if (xmlctx->status != LYXML_ELEMENT) {
            LVar6 = LY_SUCCESS;
            lyd_insert_node(local_40,(lyd_node **)0x0,node,1);
            lVar4._0_4_ = node[1].hash;
            lVar4._4_4_ = node[1].flags;
            if (lVar4 == 0) {
              if (sVar3 != 0) {
                plVar5 = node + 1;
                lydict_remove(xmlctx->ctx,(char *)node[1].prev);
                if (cVar9 == '\0') {
                  LVar6 = lydict_insert(xmlctx->ctx,local_50,sVar3,(char **)&plVar5->prev);
                  cVar9 = '\0';
                }
                else {
                  LVar6 = lydict_insert_zc(xmlctx->ctx,local_50,(char **)&plVar5->prev);
                  cVar9 = LVar6 != LY_SUCCESS;
                }
              }
            }
            else {
              LVar6 = LY_SUCCESS;
              if (lVar1 == '\0') {
                pplVar8 = &node[1].schema;
                if (node->schema != (lysc_node *)0x0) {
                  pplVar8 = (lysc_node **)&node->schema->name;
                }
                LVar6 = LY_EVALID;
                ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX_XML,
                        "Mixed XML content node \"%s\" found, not supported.",*pplVar8);
              }
            }
            break;
          }
          LVar6 = lydxml_opaq_r(xmlctx,node);
        }
      }
      else {
        cVar9 = (char)local_5c;
      }
      lyd_free_attr_siblings(xmlctx->ctx,attr);
      if (cVar9 != '\0') {
        free(local_50);
      }
      if (LVar6 == LY_SUCCESS) {
        LVar6 = LY_SUCCESS;
      }
      else {
        lyd_free_tree(node);
      }
    }
  }
  return LVar6;
}

Assistant:

static LY_ERR
lydxml_opaq_r(struct lyxml_ctx *xmlctx, struct lyd_node *parent)
{
    LY_ERR rc = LY_SUCCESS;
    const struct lyxml_ns *ns;
    struct lyd_attr *attr = NULL;
    struct lyd_node *node = NULL;
    struct lyd_node_opaq *opaq;
    const char *name, *prefix, *value = NULL;
    size_t name_len, prefix_len, value_len;
    ly_bool ws_only, dynamic = 0;

    assert(xmlctx->status == LYXML_ELEMENT);

    name = xmlctx->name;
    name_len = xmlctx->name_len;
    prefix = xmlctx->prefix;
    prefix_len = xmlctx->prefix_len;
    ns = lyxml_ns_get(&xmlctx->ns, prefix, prefix_len);
    if (!ns) {
        lydxml_log_namespace_err(xmlctx, prefix, prefix_len, NULL, 0);
        return LY_EVALID;
    }

    LY_CHECK_RET(lyxml_ctx_next(xmlctx));

    /* create attributes */
    if (xmlctx->status == LYXML_ATTRIBUTE) {
        LY_CHECK_RET(lydxml_attrs(xmlctx, &attr));
    }

    /* remember the value */
    assert(xmlctx->status == LYXML_ELEM_CONTENT);
    value = xmlctx->value;
    value_len = xmlctx->value_len;
    ws_only = xmlctx->ws_only;
    dynamic = xmlctx->dynamic;
    if (dynamic) {
        xmlctx->dynamic = 0;
    }

    /* create the node without value */
    rc = lyd_create_opaq(xmlctx->ctx, name, name_len, prefix, prefix_len, ns->uri, strlen(ns->uri), NULL, 0, NULL,
            LY_VALUE_XML, NULL, 0, &node);
    LY_CHECK_GOTO(rc, cleanup);

    /* assign atributes */
    ((struct lyd_node_opaq *)node)->attr = attr;
    attr = NULL;

    /* parser next element */
    LY_CHECK_GOTO(rc = lyxml_ctx_next(xmlctx), cleanup);

    /* parse all the descendants */
    while (xmlctx->status == LYXML_ELEMENT) {
        rc = lydxml_opaq_r(xmlctx, node);
        LY_CHECK_GOTO(rc, cleanup);
    }

    /* insert */
    lyd_insert_node(parent, NULL, node, LYD_INSERT_NODE_LAST);

    /* update the value */
    opaq = (struct lyd_node_opaq *)node;
    if (opaq->child) {
        if (!ws_only) {
            LOGVAL(xmlctx->ctx, LYVE_SYNTAX_XML, "Mixed XML content node \"%s\" found, not supported.", LYD_NAME(node));
            rc = LY_EVALID;
            goto cleanup;
        }
    } else if (value_len) {
        lydict_remove(xmlctx->ctx, opaq->value);
        if (dynamic) {
            LY_CHECK_GOTO(rc = lydict_insert_zc(xmlctx->ctx, (char *)value, &opaq->value), cleanup);
            dynamic = 0;
        } else {
            LY_CHECK_GOTO(rc = lydict_insert(xmlctx->ctx, value, value_len, &opaq->value), cleanup);
        }
    }

cleanup:
    lyd_free_attr_siblings(xmlctx->ctx, attr);
    if (dynamic) {
        free((char *)value);
    }
    if (rc) {
        lyd_free_tree(node);
    }
    return rc;
}